

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::LogicalType::read(LogicalType *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  uint uVar2;
  ssize_t sVar3;
  void *__buf_00;
  int __fd_00;
  undefined4 in_register_00000034;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff08;
  TType in_stack_ffffffffffffff0c;
  uint32_t in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  uint32_t in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  uint32_t in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined2 local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  LogicalType *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
             ,(TProtocol *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_1c = uVar1 + local_1c;
  while( true ) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       (TType *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_1c = uVar1 + local_1c;
    if (local_44 == 0) break;
    __fd_00 = (int)local_10;
    switch(local_46) {
    case 1:
      if (local_44 == 0xc) {
        sVar3 = StringType::read(&this->STRING,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xfffe | 1);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 2:
      if (local_44 == 0xc) {
        sVar3 = MapType::read(&this->MAP,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xfffd | 2);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 3:
      if (local_44 == 0xc) {
        sVar3 = ListType::read(&this->LIST,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xfffb | 4);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 4:
      if (local_44 == 0xc) {
        sVar3 = EnumType::read(&this->ENUM,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xfff7 | 8);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 5:
      if (local_44 == 0xc) {
        sVar3 = DecimalType::read(&this->DECIMAL,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xffef | 0x10);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 6:
      if (local_44 == 0xc) {
        sVar3 = DateType::read(&this->DATE,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xffdf | 0x20);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 7:
      if (local_44 == 0xc) {
        sVar3 = TimeType::read(&this->TIME,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xffbf | 0x40);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 8:
      if (local_44 == 0xc) {
        sVar3 = TimestampType::read(&this->TIMESTAMP,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xff7f | 0x80);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    default:
      in_stack_ffffffffffffff14 =
           duckdb_apache::thrift::protocol::TProtocol::skip
                     ((TProtocol *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff0c);
      local_1c = in_stack_ffffffffffffff14 + local_1c;
      break;
    case 10:
      if (local_44 == 0xc) {
        sVar3 = IntType::read(&this->INTEGER,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xfeff | 0x100);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 0xb:
      if (local_44 == 0xc) {
        sVar3 = NullType::read(&this->UNKNOWN,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xfdff | 0x200);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 0xc:
      if (local_44 == 0xc) {
        sVar3 = JsonType::read(&this->JSON,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xfbff | 0x400);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 0xd:
      if (local_44 == 0xc) {
        sVar3 = BsonType::read(&this->BSON,__fd_00,__buf_00,0xa9ca7c);
        local_1c = (int)sVar3 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xf7ff | 0x800);
      }
      else {
        uVar1 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        local_1c = uVar1 + local_1c;
      }
      break;
    case 0xe:
      if (local_44 == 0xc) {
        sVar3 = UUIDType::read(&this->UUID,__fd_00,__buf_00,0xa9ca7c);
        in_stack_ffffffffffffff24 = (int)sVar3;
        local_1c = in_stack_ffffffffffffff24 + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xefff | 0x1000);
      }
      else {
        in_stack_ffffffffffffff20 =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c);
        local_1c = in_stack_ffffffffffffff20 + local_1c;
      }
      break;
    case 0xf:
      if (local_44 == 0xc) {
        sVar3 = Float16Type::read(&this->FLOAT16,__fd_00,__buf_00,0xa9ca7c);
        in_stack_ffffffffffffff1c = (int)sVar3;
        local_1c = in_stack_ffffffffffffff1c + local_1c;
        this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xdfff | 0x2000);
      }
      else {
        in_stack_ffffffffffffff18 =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff0c);
        local_1c = in_stack_ffffffffffffff18 + local_1c;
      }
    }
    in_stack_ffffffffffffff10 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x6fcf79);
    local_1c = in_stack_ffffffffffffff10 + local_1c;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x6fcfa3);
  uVar2 = uVar1 + local_1c;
  local_1c = uVar2;
  std::__cxx11::string::~string(local_40);
  duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)0x6fcfdf);
  return (ulong)uVar2;
}

Assistant:

uint32_t LogicalType::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->STRING.read(iprot);
          this->__isset.STRING = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->MAP.read(iprot);
          this->__isset.MAP = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->LIST.read(iprot);
          this->__isset.LIST = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->ENUM.read(iprot);
          this->__isset.ENUM = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->DECIMAL.read(iprot);
          this->__isset.DECIMAL = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->DATE.read(iprot);
          this->__isset.DATE = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->TIME.read(iprot);
          this->__isset.TIME = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->TIMESTAMP.read(iprot);
          this->__isset.TIMESTAMP = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->INTEGER.read(iprot);
          this->__isset.INTEGER = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 11:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->UNKNOWN.read(iprot);
          this->__isset.UNKNOWN = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 12:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->JSON.read(iprot);
          this->__isset.JSON = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 13:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->BSON.read(iprot);
          this->__isset.BSON = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 14:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->UUID.read(iprot);
          this->__isset.UUID = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 15:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->FLOAT16.read(iprot);
          this->__isset.FLOAT16 = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}